

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O3

int nk_window_is_closed(nk_context *ctx,char *name)

{
  long lVar1;
  nk_hash hash;
  nk_window *pnVar2;
  uint uVar3;
  long lVar4;
  
  uVar3 = 1;
  if (ctx != (nk_context *)0x0) {
    lVar4 = 0;
    if ((name != (char *)0x0) && (*name != '\0')) {
      lVar4 = 0;
      do {
        lVar1 = lVar4 + 1;
        lVar4 = lVar4 + 1;
      } while (name[lVar1] != '\0');
    }
    hash = nk_murmur_hash(name,(int)lVar4,0x40);
    pnVar2 = nk_find_window(ctx,hash,name);
    if (pnVar2 != (nk_window *)0x0) {
      uVar3 = pnVar2->flags & 0x2000;
    }
  }
  return uVar3;
}

Assistant:

NK_API int
nk_window_is_closed(struct nk_context *ctx, const char *name)
{
    int title_len;
    nk_hash title_hash;
    struct nk_window *win;
    NK_ASSERT(ctx);
    if (!ctx) return 1;

    title_len = (int)nk_strlen(name);
    title_hash = nk_murmur_hash(name, (int)title_len, NK_WINDOW_TITLE);
    win = nk_find_window(ctx, title_hash, name);
    if (!win) return 1;
    return (win->flags & NK_WINDOW_CLOSED);
}